

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O3

RK_S32 trie_get_node(MppTrieImpl *trie,RK_S32 prev,RK_U64 key)

{
  int iVar1;
  MppTrieNode *pMVar2;
  RK_S16 RVar3;
  long lVar4;
  uint uVar5;
  
  uVar5 = trie->node_used;
  iVar1 = trie->node_count;
  lVar4 = (long)iVar1;
  if ((int)uVar5 < iVar1) {
    pMVar2 = trie->nodes;
  }
  else {
    uVar5 = iVar1 * 2;
    pMVar2 = (MppTrieNode *)mpp_osal_realloc("trie_get_node",trie->nodes,lVar4 * 0x70);
    if (pMVar2 == (MppTrieNode *)0x0) {
      _mpp_log_l(2,"mpp_trie","failed to realloc new nodes %d\n","trie_get_node",(ulong)uVar5);
      return -1;
    }
    memset(pMVar2 + lVar4,0,lVar4 * 0x38);
    if (((byte)mpp_trie_debug & 8) != 0) {
      _mpp_log_l(4,"mpp_trie","trie %p enlarge node %p:%d -> %p:%d\n","trie_get_node",trie,
                 trie->nodes,(ulong)(uint)trie->node_count,pMVar2,(ulong)uVar5);
    }
    trie->nodes = pMVar2;
    trie->node_count = uVar5;
    uVar5 = trie->node_used;
  }
  trie->node_used = uVar5 + 1;
  RVar3 = 0;
  if (0 < prev) {
    RVar3 = (RK_S16)prev;
  }
  pMVar2[(int)uVar5].idx = (RK_S16)uVar5;
  pMVar2[(int)uVar5].prev = RVar3;
  pMVar2[(int)uVar5].key = (RK_U16)key;
  pMVar2[(int)uVar5].id = -1;
  if (-1 < prev) {
    pMVar2[(uint)prev].next_cnt = pMVar2[(uint)prev].next_cnt + 1;
  }
  if (((byte)mpp_trie_debug & 8) != 0) {
    _mpp_log_l(4,"mpp_trie","get node %d\n","trie_get_node",(ulong)uVar5);
  }
  return uVar5;
}

Assistant:

static RK_S32 trie_get_node(MppTrieImpl *trie, RK_S32 prev, RK_U64 key)
{
    if (trie->node_used >= trie->node_count) {
        RK_S32 old_count = trie->node_count;
        RK_S32 new_count = old_count * 2;
        MppTrieNode *new_nodes = mpp_realloc(trie->nodes, MppTrieNode, new_count);

        if (!new_nodes) {
            mpp_err_f("failed to realloc new nodes %d\n", new_count);
            return -1;
        }

        /* NOTE: new memory should be memset to zero */
        memset(new_nodes + old_count, 0, sizeof(*new_nodes) * old_count);

        trie_dbg_cnt("trie %p enlarge node %p:%d -> %p:%d\n",
                     trie, trie->nodes, trie->node_count, new_nodes, new_count);

        trie->nodes = new_nodes;
        trie->node_count = new_count;
    }

    RK_S32 idx = trie->node_used++;
    MppTrieNode *n = &trie->nodes[idx];

    n->idx = idx;
    n->prev = (prev > 0) ? prev : 0;
    n->key = key;
    n->id = INVALID_NODE_ID;

    if (prev >= 0)
        trie->nodes[prev].next_cnt++;

    trie_dbg_cnt("get node %d\n", idx);

    return idx;
}